

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Brainfck.cpp
# Opt level: O0

void implementations::brainfck::BFFrameDispatcher::dispatch
               (BFFrame *frame,BFArgsSize argsSize,BFArgs *args)

{
  element_type *peVar1;
  BFOperations local_34;
  BFOperations *local_30;
  BFOperations *instruction;
  BFArgs *pBStack_20;
  BFOperations operation;
  BFArgs *args_local;
  BFFrame *pBStack_10;
  BFArgsSize argsSize_local;
  BFFrame *frame_local;
  
  pBStack_20 = args;
  args_local._4_4_ = argsSize;
  pBStack_10 = frame;
  instruction._4_4_ = BFFrame::fetch(frame);
  local_34 = BFFrame::fetch(pBStack_10);
  local_30 = &local_34;
  peVar1 = std::
           __shared_ptr_access<implementations::brainfck::BFEnvironment,_(__gnu_cxx::_Lock_policy)2,_false,_false>
           ::operator->((__shared_ptr_access<implementations::brainfck::BFEnvironment,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)&(pBStack_10->super_BFStacklessFrame).env);
  peVar1->ip = peVar1->ip + 1;
  switch(*local_30) {
  case CellIncrement:
    BFDispatcher<(implementations::brainfck::BFOperations)43>::dispatch(pBStack_10,pBStack_20);
    break;
  case CellRead:
    BFDispatcher<(implementations::brainfck::BFOperations)44>::dispatch(pBStack_10,pBStack_20);
    break;
  case CellDecrement:
    BFDispatcher<(implementations::brainfck::BFOperations)45>::dispatch(pBStack_10,pBStack_20);
    break;
  case CellPrint:
    BFDispatcher<(implementations::brainfck::BFOperations)46>::dispatch(pBStack_10,pBStack_20);
    break;
  default:
    break;
  case CellLeft:
    BFDispatcher<(implementations::brainfck::BFOperations)60>::dispatch(pBStack_10,pBStack_20);
    break;
  case CellRight:
    BFDispatcher<(implementations::brainfck::BFOperations)62>::dispatch(pBStack_10,pBStack_20);
    break;
  case CellWhile:
    BFDispatcher<(implementations::brainfck::BFOperations)91>::dispatch(pBStack_10,pBStack_20);
    break;
  case CellEndWhile:
    BFDispatcher<(implementations::brainfck::BFOperations)93>::dispatch(pBStack_10,pBStack_20);
  }
  return;
}

Assistant:

static void dispatch(BFFrame &frame, BFArgsSize argsSize, BFArgs &args) {
		// Master dispatcher
		const BFOperations operation = frame.fetch();
		
		if(verbose) std::cerr << "Fetch at " << frame.env->ipValue() << " = " << operation << ", mp = " << frame.env->mpValue() << "\n";

		const BFOperations &instruction = frame.fetch();
		++frame.env->ip;

		switch (instruction) {
		case CellRight:
			return BFDispatcher<CellRight>::dispatch(frame, args);
		case CellLeft:
			return BFDispatcher<CellLeft>::dispatch(frame, args);
		case CellIncrement:
			return BFDispatcher<CellIncrement>::dispatch(frame, args);
		case CellDecrement:
			return BFDispatcher<CellDecrement>::dispatch(frame, args);
		case CellWhile:
			return BFDispatcher<CellWhile>::dispatch(frame, args);
		case CellEndWhile:
			return BFDispatcher<CellEndWhile>::dispatch(frame, args);
		case CellPrint:
			return BFDispatcher<CellPrint>::dispatch(frame, args);
		case CellRead:
			return BFDispatcher<CellRead>::dispatch(frame, args);
		default:
			// Do nothing, as per BF rules
			break;
		}
	}